

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_data.cpp
# Opt level: O3

void Set_Euler(Euler_Data euler)

{
  bool bVar1;
  unique_lock<std::timed_mutex> euler_lock;
  double in_stack_00000018;
  unique_lock<std::timed_mutex> local_20;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  local_20._M_device = &Euler_Mutex;
  local_20._M_owns = false;
  local_10.__r = 5;
  bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_20,&local_10);
  if (bVar1) {
    Euler.yaw = in_stack_00000018;
    Euler.roll = (double)euler_lock._M_device;
    Euler.pitch = (double)euler_lock._8_8_;
    std::unique_lock<std::timed_mutex>::unlock(&local_20);
  }
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

bool Get_Run()
{
    return Run;
}